

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msh2osh.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  undefined1 auVar1 [12];
  path local_4d0 [32];
  shared_ptr<Omega_h::Comm> local_4b0;
  path local_4a0 [32];
  Mesh local_480 [8];
  Mesh mesh;
  undefined1 local_a8 [8];
  CommPtr world;
  undefined1 local_88 [8];
  Library lib;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  lib.timers._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)argv;
  argv_local._0_4_ = argc;
  Omega_h::Library::Library
            ((Library *)local_88,(int *)&argv_local,
             (char ***)&lib.timers._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if ((int)argv_local == 3) {
    Omega_h::Library::world();
    Omega_h::filesystem::path::path
              (local_4a0,*(char **)(lib.timers._M_t._M_impl.super__Rb_tree_header._M_node_count + 8)
              );
    std::shared_ptr<Omega_h::Comm>::shared_ptr(&local_4b0,(shared_ptr<Omega_h::Comm> *)local_a8);
    Omega_h::gmsh::read(local_480,local_4a0,&local_4b0);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr(&local_4b0);
    Omega_h::filesystem::path::~path(local_4a0);
    Omega_h::filesystem::path::path
              (local_4d0,
               *(char **)(lib.timers._M_t._M_impl.super__Rb_tree_header._M_node_count + 0x10));
    Omega_h::binary::write(local_4d0,local_480);
    Omega_h::filesystem::path::~path(local_4d0);
    Omega_h::Mesh::~Mesh(local_480);
    std::shared_ptr<Omega_h::Comm>::~shared_ptr((shared_ptr<Omega_h::Comm> *)local_a8);
    Omega_h::Library::~Library((Library *)local_88);
    return argv_local._4_4_;
  }
  auVar1 = Omega_h::fail("assertion %s failed at %s +%d\n","argc == 3",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/msh2osh.cpp"
                         ,5);
  world.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ =
       auVar1._8_4_;
  Omega_h::Library::~Library((Library *)local_88);
  _Unwind_Resume(auVar1._0_8_);
}

Assistant:

int main(int argc, char** argv) {
  auto lib = Omega_h::Library(&argc, &argv);
  OMEGA_H_CHECK(argc == 3);
  auto world = lib.world();
  auto mesh = Omega_h::gmsh::read(argv[1], world);
  Omega_h::binary::write(argv[2], &mesh);
}